

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderLp.cpp
# Opt level: O0

void __thiscall
FilereaderLp::writeToFileValue(FilereaderLp *this,FILE *file,double value,bool force_plus)

{
  byte in_DL;
  char *in_RSI;
  FILE *in_RDI;
  FilereaderLp *in_XMM0_Qa;
  
  if ((in_DL & 1) == 0) {
    writeToFile(in_XMM0_Qa,in_RDI,in_RSI," %.15g");
  }
  else {
    writeToFile(in_XMM0_Qa,in_RDI,in_RSI," %+.15g");
  }
  return;
}

Assistant:

void FilereaderLp::writeToFileValue(FILE* file, const double value,
                                    const bool force_plus) {
  if (original_double_format) {
    this->writeToFile(file, " %+g", value);
  } else {
    // As for writeModelAsMps
    if (force_plus) {
      this->writeToFile(file, " %+.15g", value);
    } else {
      this->writeToFile(file, " %.15g", value);
    }
  }
}